

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgtrmr(fitsfile *gfptr,HDUtracker *HDU,int *status)

{
  bool bVar1;
  int iVar2;
  ulong member;
  fitsfile *mfptr;
  long nmembers;
  int hdutype;
  char keyvalue [71];
  char comment [73];
  fitsfile *local_f0;
  long local_e8;
  int local_dc;
  char local_d8 [80];
  char local_88 [88];
  
  local_e8 = 0;
  local_f0 = (fitsfile *)0x0;
  iVar2 = *status;
  if (iVar2 == 0) {
    iVar2 = ffgtnm(gfptr,&local_e8,status);
    *status = iVar2;
    if (0 < (int)(uint)local_e8) {
      member = (ulong)((uint)local_e8 & 0x7fffffff);
      do {
        if (*status != 0) break;
        iVar2 = ffgmop(gfptr,member,&local_f0,status);
        *status = iVar2;
        if (iVar2 == 0) {
          iVar2 = fftsad(local_f0,HDU,(int *)0x0,(char *)0x0);
          *status = iVar2;
          if (iVar2 == 0) {
            iVar2 = ffgkys(local_f0,"EXTNAME",local_d8,local_88,status);
            *status = iVar2;
            if (iVar2 == 0xca) {
              *status = 0;
              local_d8[0] = '\0';
            }
            prepare_keyvalue(local_d8);
            if (*status == 0) {
              iVar2 = fits_strcasecmp(local_d8,"GROUPING");
              if (iVar2 == 0) {
                iVar2 = ffgtrmr(local_f0,HDU,status);
                *status = iVar2;
              }
              iVar2 = ffghdn(local_f0,&local_dc);
              if (iVar2 == 1) {
                iVar2 = ffgmul(local_f0,1,status);
              }
              else {
                iVar2 = ffgmul(local_f0,0,status);
                *status = iVar2;
                iVar2 = ffdhdu(local_f0,&local_dc,status);
              }
              *status = iVar2;
              ffclos(local_f0,status);
            }
          }
          else if (iVar2 == 0x15a) {
            *status = 0;
            ffclos(local_f0,status);
          }
        }
        else if (iVar2 == 0x156) {
          *status = 0;
        }
        bVar1 = 1 < (long)member;
        member = member - 1;
      } while (bVar1);
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffgtrmr(fitsfile   *gfptr,  /* FITS file pointer to group               */
	    HDUtracker *HDU,    /* list of processed HDUs                   */
	    int        *status) /* return status code                       */
	    
/*
  recursively remove a grouping table and all its members. Each member of
  the grouping table pointed to by gfptr it processed. If the member is itself
  a grouping table then ffgtrmr() is recursively called to process all
  of its members. The HDUtracker struct *HDU is used to make sure a member
  is not processed twice, thus avoiding an infinite loop (e.g., a grouping
  table contains itself as a member).
*/

{
  int i;
  int hdutype;

  long nmembers = 0;

  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];
  
  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  /* get the number of members contained by this grouping table */

  *status = fits_get_num_members(gfptr,&nmembers,status);

  /* loop over all group members and delete them */

  for(i = nmembers; i > 0 && *status == 0; --i)
    {
      /* open the member HDU */

      *status = fits_open_member(gfptr,i,&mfptr,status);

      /* if the member cannot be opened then just skip it and continue */

      if(*status == MEMBER_NOT_FOUND) 
	{
	  *status = 0;
	  continue;
	}

      /* Any other error is a reason to abort */
      
      if(*status != 0) continue;

      /* add the member HDU to the HDUtracker struct */

      *status = fftsad(mfptr,HDU,NULL,NULL);

      /* status == HDU_ALREADY_TRACKED ==> HDU has already been processed */

      if(*status == HDU_ALREADY_TRACKED) 
	{
	  *status = 0;
	  fits_close_file(mfptr,status);
	  continue;
	}
      else if(*status != 0) continue;

      /* determine if the member HDU is itself a grouping table */

      *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,comment,status);

      /* if no EXTNAME is found then the HDU cannot be a grouping table */ 

      if(*status == KEY_NO_EXIST) 
	{
	  *status     = 0;
	  keyvalue[0] = 0;
	}
      prepare_keyvalue(keyvalue);

      /* Any other error is a reason to abort */
      
      if(*status != 0) continue;

      /* 
	 if the EXTNAME == GROUPING then the member is a grouping table 
	 and we must call ffgtrmr() to process its members
      */

      if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	  *status = ffgtrmr(mfptr,HDU,status);  

      /* 
	 unlink all the grouping tables that contain this HDU as a member 
	 and then delete the HDU (if not a PHDU)
      */

      if(fits_get_hdu_num(mfptr,&hdutype) == 1)
	      *status = ffgmul(mfptr,1,status);
      else
	  {
	      *status = ffgmul(mfptr,0,status);
	      *status = fits_delete_hdu(mfptr,&hdutype,status);
	  }

      /* close the fitsfile pointer */

      fits_close_file(mfptr,status);
    }

  return(*status);
}